

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggwave.cpp
# Opt level: O0

int ggwave_ndecode(ggwave_Instance id,void *waveformBuffer,int waveformSize,void *payloadBuffer,
                  int payloadSize)

{
  bool bVar1;
  long lVar2;
  uchar *__src;
  TxRxData *in_RCX;
  undefined4 in_EDX;
  uint in_EDI;
  int in_R8D;
  int dataLength;
  GGWave *ggWave;
  uint32_t in_stack_0000008c;
  void *in_stack_00000090;
  GGWave *in_stack_00000098;
  undefined4 in_stack_ffffffffffffffe8;
  int local_4;
  
  bVar1 = GGWave::decode(in_stack_00000098,in_stack_00000090,in_stack_0000008c);
  if (bVar1) {
    lVar2 = __tls_get_addr(&PTR_0011afb8);
    if (*(char *)(lVar2 + 0x28) == '\0') {
      lVar2 = __tls_get_addr(&PTR_0011afb8);
      ggvector<unsigned_char>::ggvector((ggvector<unsigned_char> *)(lVar2 + 0x18));
      lVar2 = __tls_get_addr(&PTR_0011afb8);
      *(undefined1 *)(lVar2 + 0x28) = 1;
    }
    __tls_get_addr(&PTR_0011afb8);
    local_4 = GGWave::rxTakeData((GGWave *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),in_RCX);
    if (local_4 == -1) {
      local_4 = -1;
    }
    else if (in_R8D < local_4) {
      local_4 = -2;
    }
    else if (0 < local_4) {
      lVar2 = __tls_get_addr(&PTR_0011afb8);
      __src = ggvector<unsigned_char>::data((ggvector<unsigned_char> *)(lVar2 + 0x18));
      memcpy(in_RCX,__src,(long)local_4);
    }
  }
  else {
    if ((anonymous_namespace)::g_fptr != (FILE *)0x0) {
      fprintf((anonymous_namespace)::g_fptr,"Failed to decode data - GGWave instance %d\n",
              (ulong)in_EDI);
    }
    local_4 = -1;
  }
  return local_4;
}

Assistant:

int ggwave_ndecode(
        ggwave_Instance id,
        const void * waveformBuffer,
        int waveformSize,
        void * payloadBuffer,
        int payloadSize) {
    GGWave * ggWave = (GGWave *) g_instances[id];

    if (ggWave->decode(waveformBuffer, waveformSize) == false) {
        ggprintf("Failed to decode data - GGWave instance %d\n", id);
        return -1;
    }

    static thread_local GGWave::TxRxData data;

    const auto dataLength = ggWave->rxTakeData(data);
    if (dataLength == -1) {
        // failed to decode message
        return -1;
    } else if (dataLength > payloadSize) {
        // the payloadBuffer is not big enough to store the data
        return -2;
    } else if (dataLength > 0) {
        memcpy(payloadBuffer, data.data(), dataLength);
    }

    return dataLength;
}